

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O3

void cp_expr_unary(CPState *cp,CPValue *k)

{
  anon_union_4_2_43a9a9ed_for_CPValue_0 aVar1;
  CPToken CVar2;
  CTypeID CVar3;
  anon_union_4_2_43a9a9ed_for_CPValue_0 aVar4;
  CTSize CVar5;
  CType *ct;
  CType *pCVar6;
  GCstr *pGVar7;
  uint uVar8;
  int iVar9;
  MSize MVar10;
  CPValue k2;
  CTSize local_3c;
  CPValue local_38;
  
  iVar9 = cp->depth;
  cp->depth = iVar9 + 1;
  if (0x13 < iVar9) {
    cp_err(cp,LJ_ERR_XLEVELS);
  }
  iVar9 = cp->tok;
  if (0x7d < iVar9) {
    if (iVar9 < 0x102) {
      if (iVar9 == 0x7e) {
        cp_next(cp);
        cp_expr_unary(cp,k);
        (k->field_0).u32 = ~(k->field_0).u32;
        goto LAB_0013be36;
      }
      if (iVar9 != 0x100) {
        if (iVar9 != 0x101) {
switchD_0013bbea_caseD_22:
          cp_errmsg(cp,iVar9,LJ_ERR_XSYMBOL);
        }
        MVar10 = cp->str->len;
        while (CVar2 = cp_next(cp), CVar2 == 0x101) {
          MVar10 = MVar10 + cp->str->len;
        }
        (k->field_0).i32 = MVar10 + 1;
        k->id = 0x14;
        goto LAB_0013be36;
      }
      uVar8 = cp->ct->info >> 0x1c;
      if (uVar8 == 6) {
        aVar4 = (anon_union_4_2_43a9a9ed_for_CPValue_0)(cp->val).id;
        k->field_0 = aVar4;
      }
      else {
        if (uVar8 == 0xc) {
          aVar4 = (anon_union_4_2_43a9a9ed_for_CPValue_0)(cp->val).id;
        }
        else {
          if (uVar8 != 0xb) goto switchD_0013bbea_caseD_22;
          aVar4 = (anon_union_4_2_43a9a9ed_for_CPValue_0)cp->ct->size;
        }
        k->field_0 = aVar4;
        aVar4.i32._2_2_ = 0;
        aVar4.i32._0_2_ = (ushort)cp->ct->info;
      }
      k->id = (CTypeID)aVar4;
LAB_0013be2e:
      cp_next(cp);
    }
    else {
      if (iVar9 == 299) {
        cp_next(cp);
        iVar9 = 0;
      }
      else {
        if (iVar9 != 0x12a) {
          if (iVar9 != 0x102) goto switchD_0013bbea_caseD_22;
          *k = cp->val;
          goto LAB_0013be2e;
        }
        cp_next(cp);
        iVar9 = 1;
      }
      cp_expr_sizeof(cp,k,iVar9);
    }
    goto LAB_0013be36;
  }
  switch(iVar9) {
  case 0x21:
    cp_next(cp);
    cp_expr_unary(cp,k);
    aVar1.i32._1_3_ = 0;
    aVar1.i32._0_1_ = (k->field_0).i32 == 0;
    k->field_0 = aVar1;
    k->id = 9;
    break;
  default:
    goto switchD_0013bbea_caseD_22;
  case 0x26:
    cp_next(cp);
    cp_expr_unary(cp,k);
    CVar3 = lj_ctype_intern(cp->cts,k->id + 0x20030000,8);
    goto LAB_0013bd7d;
  case 0x28:
    cp_next(cp);
    iVar9 = cp->tok;
    if (((iVar9 - 0x10dU < 0x1d) || (iVar9 == 0x24)) ||
       ((iVar9 == 0x100 && ((cp->ct->info & 0xf0000000) == 0x70000000)))) {
      CVar3 = cp_decl_abstract(cp);
      cp_check(cp,0x29);
      cp_expr_unary(cp,k);
      k->id = CVar3;
    }
    else {
      cp_expr_comma(cp,k);
      cp_check(cp,0x29);
    }
    break;
  case 0x2a:
    cp_next(cp);
    cp_expr_unary(cp,k);
    pCVar6 = lj_ctype_rawref(cp->cts,k->id);
    if ((pCVar6->info & 0xe0000000) != 0x20000000) {
      cp_err_badidx(cp,pCVar6);
    }
    (k->field_0).i32 = 0;
    CVar3 = (CTypeID)(ushort)pCVar6->info;
LAB_0013bd7d:
    k->id = CVar3;
    break;
  case 0x2b:
    cp_next(cp);
    cp_expr_unary(cp,k);
    break;
  case 0x2d:
    cp_next(cp);
    cp_expr_unary(cp,k);
    (k->field_0).i32 = -(k->field_0).i32;
  }
LAB_0013be36:
  do {
    iVar9 = cp->tok;
    if ((iVar9 == 0x2e) || (iVar9 == 0x10c)) {
      pCVar6 = lj_ctype_rawref(cp->cts,k->id);
      if (cp->tok == 0x10c) {
        if ((pCVar6->info & 0xe0000000) != 0x20000000) {
          cp_err_badidx(cp,pCVar6);
        }
        pCVar6 = lj_ctype_rawref(cp->cts,pCVar6->info & 0xffff);
      }
      cp_next(cp);
      if (cp->tok != 0x100) {
        cp_err_token(cp,0x100);
      }
      if ((((pCVar6->info & 0xf0000000) != 0x10000000) || (pCVar6->size == 0xffffffff)) ||
         (ct = lj_ctype_getfieldq(cp->cts,pCVar6,cp->str,&local_3c,(CTInfo *)0x0),
         ct == (CType *)0x0)) {
LAB_0013bfb8:
        pGVar7 = lj_ctype_repr(cp->cts->L,(CTypeID)((ulong)((long)pCVar6 - (long)cp->cts->tab) >> 4)
                               ,(GCstr *)0x0);
        cp_errmsg(cp,0,LJ_ERR_FFI_BADMEMBER,pGVar7 + 1,cp->str + 1);
      }
      uVar8 = ct->info >> 0x1c;
      if (uVar8 == 0xb) {
        CVar5 = ct->size;
      }
      else {
        CVar5 = 0;
        if (uVar8 == 10) goto LAB_0013bfb8;
      }
      (k->field_0).i32 = CVar5;
      cp_next(cp);
    }
    else {
      if (iVar9 != 0x5b) {
        cp->depth = cp->depth + -1;
        return;
      }
      cp_next(cp);
      cp_expr_comma(cp,&local_38);
      ct = lj_ctype_rawref(cp->cts,k->id);
      if (((ct->info & 0xe0000000) != 0x20000000) &&
         (ct = lj_ctype_rawref(cp->cts,local_38.id), (ct->info & 0xe0000000) != 0x20000000)) {
        cp_err_badidx(cp,ct);
      }
      cp_check(cp,0x5d);
      (k->field_0).i32 = 0;
    }
    k->id = (uint)(ushort)ct->info;
  } while( true );
}

Assistant:

static void cp_expr_unary(CPState *cp, CPValue *k)
{
  if (++cp->depth > CPARSE_MAX_DECLDEPTH) cp_err(cp, LJ_ERR_XLEVELS);
  cp_expr_prefix(cp, k);
  cp_expr_postfix(cp, k);
  cp->depth--;
}